

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O2

int PMPML_TestSpeedAlt_64_out_32(void *key,int len,int iter)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  undefined8 local_50;
  uint64_t ctr;
  
  uVar1 = len & 3;
  iVar19 = 0;
  uVar13 = ~(iter >> 0x1f) & iter;
  do {
    uVar11 = 1;
    bVar20 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    if (bVar20) {
      return iVar19;
    }
    if (0x1f < (uint)len) {
      if ((uint)len < 0x200) {
        uVar3 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThanChunk
                          (&pmpml_hasher_64_out_32,(uchar *)key,len);
      }
      else if ((uint)len < 0x1000) {
        uVar3 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
                          (&pmpml_hasher_64_out_32,(uchar *)key,len);
      }
      else {
        uVar3 = PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_type2
                          (&pmpml_hasher_64_out_32,(uchar *)key,len);
      }
      goto LAB_001792db;
    }
    local_50 = (pmpml_hasher_64_out_32.curr_rd)->const_term;
    ctr._0_4_ = 0;
    switch((ulong)((uint)len >> 2)) {
    case 1:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      local_50 = local_50 + uVar11;
      uVar3 = (uint)bVar20;
      ctr._0_4_ = (uint)bVar20;
      uVar11 = 1;
      switch(uVar1) {
      case 0:
        goto switchD_001790dd_caseD_0;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      goto switchD_001790dd_caseD_1;
    case 2:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      uVar11 = local_50 + uVar11;
      uVar4 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      local_50 = uVar11 + uVar4;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar11,uVar4);
      uVar11 = 1;
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
        goto switchD_001790dd_caseD_1;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      break;
    case 3:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      uVar11 = local_50 + uVar11;
      uVar4 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      uVar6 = uVar11 + uVar4;
      uVar5 = (ulong)*(uint *)((long)key + 8) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
      local_50 = uVar6 + uVar5;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar11,uVar4) + (uint)CARRY8(uVar6,uVar5);
      uVar11 = 1;
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
        goto switchD_001790dd_caseD_1;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      break;
    case 4:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      uVar11 = local_50 + uVar11;
      uVar4 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      uVar7 = uVar11 + uVar4;
      uVar5 = (ulong)*(uint *)((long)key + 8) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
      uVar8 = uVar7 + uVar5;
      uVar6 = (ulong)*(uint *)((long)key + 0xc) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
      local_50 = uVar8 + uVar6;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar11,uVar4) + (uint)CARRY8(uVar7,uVar5) +
                  (uint)CARRY8(uVar8,uVar6);
      uVar11 = 1;
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
        goto switchD_001790dd_caseD_1;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      break;
    case 5:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      uVar11 = local_50 + uVar11;
      uVar4 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      uVar8 = uVar11 + uVar4;
      uVar5 = (ulong)*(uint *)((long)key + 8) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
      uVar9 = uVar8 + uVar5;
      uVar6 = (ulong)*(uint *)((long)key + 0xc) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
      uVar10 = uVar9 + uVar6;
      uVar7 = (ulong)*(uint *)((long)key + 0x10) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
      local_50 = uVar10 + uVar7;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar11,uVar4) + (uint)CARRY8(uVar8,uVar5) +
                  (uint)CARRY8(uVar9,uVar6) + (uint)CARRY8(uVar10,uVar7);
      uVar11 = 1;
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
        goto switchD_001790dd_caseD_1;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      break;
    case 6:
      uVar11 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar11);
      uVar11 = local_50 + uVar11;
      uVar4 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      uVar9 = uVar11 + uVar4;
      uVar5 = (ulong)*(uint *)((long)key + 8) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
      uVar10 = uVar9 + uVar5;
      uVar6 = (ulong)*(uint *)((long)key + 0xc) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
      uVar14 = uVar10 + uVar6;
      uVar7 = (ulong)*(uint *)((long)key + 0x10) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
      uVar15 = uVar14 + uVar7;
      uVar8 = (ulong)*(uint *)((long)key + 0x14) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
      local_50 = uVar15 + uVar8;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar11,uVar4) + (uint)CARRY8(uVar9,uVar5) +
                  (uint)CARRY8(uVar10,uVar6) + (uint)CARRY8(uVar14,uVar7) +
                  (uint)CARRY8(uVar15,uVar8);
      uVar11 = 1;
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
        goto switchD_001790dd_caseD_1;
      case 2:
        goto switchD_001790dd_caseD_2;
      case 3:
        goto switchD_001790dd_caseD_3;
      }
      break;
    default:
      uVar4 = (ulong)*key * (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[0];
      bVar20 = CARRY8(local_50,uVar4);
      uVar4 = local_50 + uVar4;
      uVar5 = (ulong)*(uint *)((long)key + 4) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[1];
      uVar14 = uVar4 + uVar5;
      uVar6 = (ulong)*(uint *)((long)key + 8) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[2];
      uVar15 = uVar14 + uVar6;
      uVar7 = (ulong)*(uint *)((long)key + 0xc) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[3];
      uVar16 = uVar15 + uVar7;
      uVar8 = (ulong)*(uint *)((long)key + 0x10) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[4];
      uVar17 = uVar16 + uVar8;
      uVar9 = (ulong)*(uint *)((long)key + 0x14) *
              (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[5];
      uVar18 = uVar17 + uVar9;
      uVar10 = (ulong)*(uint *)((long)key + 0x18) *
               (ulong)(pmpml_hasher_64_out_32.curr_rd)->random_coeff[6];
      local_50 = uVar18 + uVar10;
      ctr._0_4_ = (uint)bVar20 + (uint)CARRY8(uVar4,uVar5) + (uint)CARRY8(uVar14,uVar6) +
                  (uint)CARRY8(uVar15,uVar7) + (uint)CARRY8(uVar16,uVar8) +
                  (uint)CARRY8(uVar17,uVar9) + (uint)CARRY8(uVar18,uVar10);
    case 0:
      uVar3 = (uint)ctr;
      switch(uVar1) {
      case 1:
switchD_001790dd_caseD_1:
        ctr._0_4_ = uVar3;
        uVar11 = (ulong)(*(byte *)((long)key + (ulong)(len - 1)) | 0x100);
        break;
      case 2:
switchD_001790dd_caseD_2:
        ctr._0_4_ = uVar3;
        uVar11 = (ulong)(*(ushort *)((long)key + ((ulong)(uint)len - 2)) | 0x10000);
        break;
      case 3:
switchD_001790dd_caseD_3:
        ctr._0_4_ = uVar3;
        uVar11 = (ulong)((uint)*(byte *)((long)key + (ulong)(len - 1)) * 0x10000 + 0x1000000 +
                        (uint)*(ushort *)((long)key + ((ulong)(uint)len - 3)));
      }
    }
switchD_001790dd_caseD_0:
    uVar11 = uVar11 * (pmpml_hasher_64_out_32.curr_rd)->random_coeff[(uint)len >> 2];
    uVar4 = local_50 + uVar11;
    ctr._0_4_ = (uint)ctr + CARRY8(local_50,uVar11);
    uVar11 = (uVar4 >> 0x20) * 0xf;
    uVar3 = (int)(uVar11 >> 0x20) * 0xf + 0xf + (uint)ctr * 0xe1;
    local_50._0_4_ = (uint)uVar4;
    local_50 = CONCAT44(CARRY4((uint)local_50,uVar3) + 1,(uint)local_50 + uVar3);
    local_50 = local_50 - (uVar11 & 0xffffffff);
    uVar2 = (uint)local_50;
    iVar12 = (int)(local_50 >> 0x20);
    if (uVar2 < 0x1e) {
      if (local_50 >> 0x20 == 0) {
        uVar3 = uVar2 * -0x54c41ab1;
        goto LAB_001792d4;
      }
      iVar12 = iVar12 * -0xf;
      uVar3 = uVar2 + 0xf + iVar12;
      if (0xe < uVar3) {
        uVar2 = iVar12 + uVar2;
        uVar3 = (uVar2 >> 0xd ^ uVar2) * -0x54c41ab1;
        goto LAB_001792d4;
      }
    }
    else {
      uVar2 = iVar12 * -0xf + uVar2;
      uVar3 = (uVar2 >> 0xd ^ uVar2) * -0x54c41ab1;
LAB_001792d4:
      uVar3 = uVar3 >> 0x10 ^ uVar3;
    }
LAB_001792db:
    iVar19 = iVar19 + uVar3;
  } while( true );
}

Assistant:

int PMPML_TestSpeedAlt_64_out_32( const void * key, int len, int iter )
{
	int dummy = 0;
	for ( int i=0; i<iter; i++ )
	{
		dummy += pmpml_hasher_64_out_32.hash( (unsigned char*)key, len );
	}
	return dummy;
}